

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToComplement
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  bool bVar2;
  Char CVar3;
  Char CVar4;
  uint uVar5;
  uint local_24;
  uint i;
  CharSet<char16_t> *result_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if (bVar2) {
    Sort(this);
    uVar5 = GetCompactLength(this);
    if (uVar5 == 0) {
      uVar5 = GetCompactLength(this);
      if (uVar5 == 0) {
        CVar4 = Chars<char16_t>::UTC(0);
        CVar3 = Chars<char16_t>::UTC(0xffff);
        SetRange(result,allocator,CVar4,CVar3);
      }
    }
    else {
      uVar5 = GetCompactCharU(this,0);
      if (uVar5 != 0) {
        CVar4 = Chars<char16_t>::UTC(0);
        uVar5 = GetCompactCharU(this,0);
        CVar3 = Chars<char16_t>::UTC(uVar5 - 1);
        SetRange(result,allocator,CVar4,CVar3);
      }
      for (local_24 = 0; uVar5 = GetCompactLength(this), local_24 < uVar5 - 1;
          local_24 = local_24 + 1) {
        uVar5 = GetCompactCharU(this,local_24);
        CVar4 = Chars<char16_t>::UTC(uVar5 + 1);
        uVar5 = GetCompactCharU(this,local_24 + 1);
        CVar3 = Chars<char16_t>::UTC(uVar5 - 1);
        SetRange(result,allocator,CVar4,CVar3);
      }
      uVar5 = GetCompactLength(this);
      uVar5 = GetCompactCharU(this,uVar5 - 1);
      if (uVar5 < 0xffff) {
        uVar5 = GetCompactLength(this);
        uVar5 = GetCompactCharU(this,uVar5 - 1);
        CVar4 = Chars<char16_t>::UTC(uVar5 + 1);
        CVar3 = Chars<char16_t>::UTC(0xffff);
        SetRange(result,allocator,CVar4,CVar3);
      }
    }
  }
  else {
    CharBitvec::ToComplement<char16_t>(&(this->rep).full.direct,allocator,0,result);
    if ((this->rep).compact.countPlusOne == 0) {
      CVar4 = Chars<char16_t>::UTC(0x100);
      SetRange(result,allocator,CVar4,L'\xffff');
    }
    else {
      pCVar1 = (this->rep).full.root;
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,2,0,result);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToComplement(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        if (IsCompact())
        {
            Sort();
            if (this->GetCompactLength() > 0)
            {
                if (this->GetCompactCharU(0) > 0)
                    result.SetRange(allocator, UTC(0), UTC(this->GetCompactCharU(0) - 1));
                for (uint i = 0; i < this->GetCompactLength() - 1; i++)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(i) + 1), UTC(this->GetCompactCharU(i + 1) - 1));
                }
                if (this->GetCompactCharU(this->GetCompactLength() - 1) < MaxUChar)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(this->GetCompactLength() - 1) + 1), UTC(MaxUChar));
                }
            }
            else if (this->GetCompactLength() == 0)
            {
                result.SetRange(allocator, UTC(0), UTC(MaxUChar));
            }
        }
        else
        {
            rep.full.direct.ToComplement<char16>(allocator, 0, result);
            if (rep.full.root == nullptr)
                result.SetRange(allocator, UTC(CharSetNode::directSize), MaxChar);
            else
                rep.full.root->ToComplement(allocator, CharSetNode::levels - 1, 0, result);
        }
    }